

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O1

Result * CoreML::validateFeatureDescriptions
                   (Result *__return_storage_ptr__,ModelDescription *interface,int modelVersion)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Rep *pRVar2;
  pointer pcVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  void **ppvVar7;
  bool bVar8;
  string local_58;
  ModelDescription *local_38;
  
  if ((interface->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Models must have one or more inputs.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_58);
  }
  else {
    if (0 < (interface->output_).super_RepeatedPtrFieldBase.current_size_) {
      pRVar2 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
      ppvVar7 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar7 = (void **)0x0;
      }
      lVar5 = (long)(interface->input_).super_RepeatedPtrFieldBase.current_size_;
      bVar8 = lVar5 == 0;
      local_38 = interface;
      if (!bVar8) {
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        lVar6 = 0;
        do {
          validateFeatureDescription
                    (__return_storage_ptr__,*(FeatureDescription **)((long)ppvVar7 + lVar6),
                     modelVersion,true);
          bVar4 = Result::good(__return_storage_ptr__);
          if (!bVar4) {
            if (!bVar8) {
              return __return_storage_ptr__;
            }
            break;
          }
          pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != paVar1) {
            operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
          }
          lVar6 = lVar6 + 8;
          bVar8 = lVar5 * 8 == lVar6;
        } while (!bVar8);
      }
      pRVar2 = (local_38->output_).super_RepeatedPtrFieldBase.rep_;
      ppvVar7 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar7 = (void **)0x0;
      }
      lVar5 = (long)(local_38->output_).super_RepeatedPtrFieldBase.current_size_;
      bVar8 = lVar5 == 0;
      if (!bVar8) {
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        lVar6 = 0;
        do {
          validateFeatureDescription
                    (__return_storage_ptr__,*(FeatureDescription **)((long)ppvVar7 + lVar6),
                     modelVersion,false);
          bVar4 = Result::good(__return_storage_ptr__);
          if (!bVar4) {
            if (!bVar8) {
              return __return_storage_ptr__;
            }
            break;
          }
          pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != paVar1) {
            operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
          }
          lVar6 = lVar6 + 8;
          bVar8 = lVar5 * 8 == lVar6;
        } while (!bVar8);
      }
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Models must have one or more outputs.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateFeatureDescriptions(const Specification::ModelDescription& interface, int modelVersion) {
        // a model must have at least one input and one output
        if (interface.input_size() < 1) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Models must have one or more inputs.");
        }
        if (interface.output_size() < 1) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Models must have one or more outputs.");
        }

        for (const auto& input : interface.input()) {
            Result r = validateFeatureDescription(input, modelVersion, true);
            if (!r.good()) { return r; }
        }

        for (const auto& output : interface.output()) {
            Result r = validateFeatureDescription(output, modelVersion, false);
            if (!r.good()) { return r; }
        }

        // If we got here, all inputs/outputs seem good independently of each other.
        return Result();
    }